

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.cc
# Opt level: O0

void load_GL_IMG_bindless_texture(GLADloadproc load)

{
  code *in_RDI;
  
  if (GLAD_GL_IMG_bindless_texture != 0) {
    glad_glGetTextureHandleIMG = (PFNGLGETTEXTUREHANDLEIMGPROC)(*in_RDI)("glGetTextureHandleIMG");
    glad_glGetTextureSamplerHandleIMG =
         (PFNGLGETTEXTURESAMPLERHANDLEIMGPROC)(*in_RDI)("glGetTextureSamplerHandleIMG");
    glad_glUniformHandleui64IMG = (PFNGLUNIFORMHANDLEUI64IMGPROC)(*in_RDI)("glUniformHandleui64IMG")
    ;
    glad_glUniformHandleui64vIMG =
         (PFNGLUNIFORMHANDLEUI64VIMGPROC)(*in_RDI)("glUniformHandleui64vIMG");
    glad_glProgramUniformHandleui64IMG =
         (PFNGLPROGRAMUNIFORMHANDLEUI64IMGPROC)(*in_RDI)("glProgramUniformHandleui64IMG");
    glad_glProgramUniformHandleui64vIMG =
         (PFNGLPROGRAMUNIFORMHANDLEUI64VIMGPROC)(*in_RDI)("glProgramUniformHandleui64vIMG");
  }
  return;
}

Assistant:

static void load_GL_IMG_bindless_texture(GLADloadproc load) {
	if(!GLAD_GL_IMG_bindless_texture) return;
	glad_glGetTextureHandleIMG = (PFNGLGETTEXTUREHANDLEIMGPROC)load("glGetTextureHandleIMG");
	glad_glGetTextureSamplerHandleIMG = (PFNGLGETTEXTURESAMPLERHANDLEIMGPROC)load("glGetTextureSamplerHandleIMG");
	glad_glUniformHandleui64IMG = (PFNGLUNIFORMHANDLEUI64IMGPROC)load("glUniformHandleui64IMG");
	glad_glUniformHandleui64vIMG = (PFNGLUNIFORMHANDLEUI64VIMGPROC)load("glUniformHandleui64vIMG");
	glad_glProgramUniformHandleui64IMG = (PFNGLPROGRAMUNIFORMHANDLEUI64IMGPROC)load("glProgramUniformHandleui64IMG");
	glad_glProgramUniformHandleui64vIMG = (PFNGLPROGRAMUNIFORMHANDLEUI64VIMGPROC)load("glProgramUniformHandleui64vIMG");
}